

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bit_cost_t __thiscall
lzham::lzcompressor::state::get_cost
          (state *this,CLZBase *lzbase,search_accelerator *dict,lzdecision *lzdec)

{
  ushort uVar1;
  int iVar2;
  uint dist;
  uchar *puVar3;
  uint uVar4;
  undefined8 in_RAX;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int limit;
  int iVar13;
  long lVar14;
  uint match_extra;
  uint match_slot;
  
  uVar4 = lzdec->m_pos;
  iVar13 = uVar4 - this->m_block_start_dict_ofs;
  if (iVar13 < 1) {
    uVar12 = 0;
  }
  else {
    uVar12 = (uint)(dict->m_dict).m_p[uVar4 - 1];
  }
  uVar6 = (this->super_state_base).m_cur_state;
  uVar7 = (ulong)uVar6;
  iVar2 = lzdec->m_len;
  lVar11 = (long)iVar2;
  uVar1 = *(ushort *)
           ((long)(&this->super_state_base + 1) + (ulong)(uVar6 << 6 | uVar12 >> 2) * 2 + 4);
  uVar9 = 0x800 - uVar1;
  if (lVar11 < 1) {
    uVar9 = (uint)uVar1;
  }
  uVar10 = (ulong)*(uint *)(gProbCost + (ulong)uVar9 * 4);
  if (lVar11 < 1) {
    puVar3 = (dict->m_dict).m_p;
    bVar8 = puVar3[uVar4];
    if (uVar6 < 7) {
      uVar6 = 0;
      if (1 < iVar13) {
        uVar6 = puVar3[uVar4 - 2] >> 2 & 0x38;
      }
      pcVar5 = this->m_lit_table[0].m_unused_alignment +
               ((ulong)((uVar12 >> 5 | uVar6) << 7) - 0x30);
    }
    else {
      uVar12 = (this->super_state_base).m_match_hist[0];
      bVar8 = bVar8 ^ puVar3[uVar4 - uVar12 & dict->m_max_dict_size_mask];
      pcVar5 = this->m_delta_lit_table[0].m_unused_alignment +
               ((ulong)(((uint)(puVar3[uVar4 - uVar12 & dict->m_max_dict_size_mask] >> 5) +
                        (uint)(puVar3[~uVar12 + uVar4 & dict->m_max_dict_size_mask] >> 5) * 8) *
                       0x80) - 0x30);
    }
    return (long)(int)((uint)*(byte *)(*(long *)pcVar5 + (ulong)bVar8) << 0x18) + uVar10;
  }
  dist = lzdec->m_dist;
  uVar1 = *(ushort *)((long)this->m_lit_table + uVar7 * 2 + -0x7c);
  if (-1 < (int)dist) {
    lVar14 = *(uint *)(gProbCost + (ulong)uVar1 * 4) + uVar10;
    _match_extra = in_RAX;
    CLZBase::compute_lzx_position_slot(lzbase,dist,&match_slot,&match_extra);
    iVar13 = lzdec->m_len;
    if ((long)iVar13 < 9) {
      uVar4 = iVar13 - 2;
    }
    else {
      lVar14 = lVar14 + (int)((uint)this->m_large_len_table
                                    [6 < (this->super_state_base).m_cur_state].
                                    super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                    [(long)iVar13 + -9] << 0x18);
      uVar4 = 7;
    }
    lVar14 = (int)((uint)(this->m_main_table).super_raw_quasi_adaptive_huffman_data_model.
                         m_code_sizes.m_p[(match_slot * 8 - 8 | uVar4) + 2] << 0x18) + lVar14;
    bVar8 = (lzbase->super_CLZDecompBase).m_lzx_position_extra_bits[match_slot];
    if (bVar8 < 3) {
      uVar7 = (ulong)bVar8 << 0x18;
    }
    else {
      uVar7 = 0;
      if (4 < bVar8) {
        uVar7 = (ulong)((uint)bVar8 * 0x1000000 + 0xfc000000);
      }
      uVar7 = (long)(int)((uint)(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model
                                .m_code_sizes.m_p[match_extra & 0xf] << 0x18) + uVar7;
    }
    goto LAB_0010e0c2;
  }
  if (dist == 0xffffffff) {
    lVar14 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4) + uVar10 +
             (ulong)*(uint *)(gProbCost +
                             (ulong)(0x800 - *(ushort *)((long)this->m_lit_table + uVar7 * 2 + -100)
                                    ) * 4);
    uVar1 = *(ushort *)((long)this->m_lit_table + uVar7 * 2 + -0x4c);
    if (iVar2 != 1) {
      uVar7 = (long)(int)((uint)this->m_rep_len_table[6 < uVar6].
                                super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                                [lVar11 + -2] << 0x18) +
              (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
      goto LAB_0010e0c2;
    }
LAB_0010e090:
    uVar7 = (ulong)(0x800 - uVar1);
  }
  else {
    lVar14 = *(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4) + uVar10 +
             (ulong)*(uint *)(gProbCost +
                             (ulong)*(ushort *)((long)this->m_lit_table + uVar7 * 2 + -100) * 4) +
             (long)(int)((uint)this->m_rep_len_table[6 < uVar6].
                               super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                               [iVar2 - 2] << 0x18);
    uVar1 = *(ushort *)((long)this->m_lit_table + uVar7 * 2 + -0x34);
    if (dist == 0xfffffffe) goto LAB_0010e090;
    lVar14 = lVar14 + (ulong)*(uint *)(gProbCost + (ulong)uVar1 * 4);
    uVar1 = *(ushort *)(this->m_lit_table[0].m_unused_alignment + uVar7 * 2 + -0x6c);
    uVar7 = (ulong)uVar1;
    if (dist == 0xfffffffd) {
      uVar7 = (ulong)*(uint *)(gProbCost + (ulong)(0x800 - uVar1) * 4);
      goto LAB_0010e0c2;
    }
  }
  uVar7 = (ulong)*(uint *)(gProbCost + uVar7 * 4);
LAB_0010e0c2:
  return lVar14 + uVar7;
}

Assistant:

bit_cost_t lzcompressor::state::get_cost(CLZBase& lzbase, const search_accelerator& dict, const lzdecision& lzdec) const
   {
      const uint lit_pred0 = get_pred_char(dict, lzdec.m_pos, 1);

      uint is_match_model_index = LZHAM_COMPUTE_IS_MATCH_MODEL_INDEX(lit_pred0, m_cur_state);
      LZHAM_ASSERT(is_match_model_index < LZHAM_ARRAY_SIZE(m_is_match_model));
      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(lzdec.is_match());

      if (!lzdec.is_match())
      {
         const uint lit = dict[lzdec.m_pos];

         if (m_cur_state < CLZBase::cNumLitStates)
         {
            const uint lit_pred1 = get_pred_char(dict, lzdec.m_pos, 2);

            uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
                            (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

            // literal
            cost += m_lit_table[lit_pred].get_cost(lit);
         }
         else
         {
            // delta literal
            const uint rep_lit0 = dict[(lzdec.m_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
            const uint rep_lit1 = dict[(lzdec.m_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

            uint delta_lit = rep_lit0 ^ lit;

            uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
                            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

            cost += m_delta_lit_table[lit_pred].get_cost(delta_lit);
         }
      }
      else
      {
         // match
         if (lzdec.m_dist < 0)
         {
            // rep match
            cost += m_is_rep_model[m_cur_state].get_cost(1);

            int match_hist_index = -lzdec.m_dist - 1;

            if (!match_hist_index)
            {
               // rep0 match
               cost += m_is_rep0_model[m_cur_state].get_cost(1);

               if (lzdec.m_len == 1)
               {
                  // single byte rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(1);
               }
               else
               {
                  // normal rep0
                  cost += m_is_rep0_single_byte_model[m_cur_state].get_cost(0);

                  cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);
               }
            }
            else
            {
               cost += m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - cMinMatchLen);

               // rep1-rep3 match
               cost += m_is_rep0_model[m_cur_state].get_cost(0);

               if (match_hist_index == 1)
               {
                  // rep1
                  cost += m_is_rep1_model[m_cur_state].get_cost(1);
               }
               else
               {
                  cost += m_is_rep1_model[m_cur_state].get_cost(0);

                  if (match_hist_index == 2)
                  {
                     // rep2
                     cost += m_is_rep2_model[m_cur_state].get_cost(1);
                  }
                  else
                  {
                     LZHAM_ASSERT(match_hist_index == 3);
                     // rep3
                     cost += m_is_rep2_model[m_cur_state].get_cost(0);
                  }
               }
            }
         }
         else
         {
            cost += m_is_rep_model[m_cur_state].get_cost(0);

            LZHAM_ASSERT(lzdec.m_len >= cMinMatchLen);

            // full match
            uint match_slot, match_extra;
            lzbase.compute_lzx_position_slot(lzdec.m_dist, match_slot, match_extra);

            uint match_low_sym = 0;
            if (lzdec.m_len >= 9)
            {
               match_low_sym = 7;
               cost += m_large_len_table[m_cur_state >= CLZBase::cNumLitStates].get_cost(lzdec.m_len - 9);
            }
            else
               match_low_sym = lzdec.m_len - 2;

            uint match_high_sym = 0;

            LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));
            match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

            uint main_sym = match_low_sym | (match_high_sym << 3);

            cost += m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);

            uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];
            if (num_extra_bits < 3)
               cost += (num_extra_bits << cBitCostScaleShift);
            else
            {
               if (num_extra_bits > 4)
                  cost += ((num_extra_bits - 4) << cBitCostScaleShift);

               cost += m_dist_lsb_table.get_cost(match_extra & 15);
            }
         }
      }

      return cost;
   }